

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O0

char * sfnt_get_var_ps_name(TT_Face face)

{
  FT_UInt FVar1;
  undefined4 fixed;
  long lVar2;
  FT_Service_MultiMasters memory_00;
  byte bVar3;
  char cVar4;
  size_t sVar5;
  char *pcVar6;
  uint local_e4;
  FT_UInt32 *pFStack_e0;
  FT_UInt32 v;
  FT_UInt32 *h;
  FT_UInt32 hash [4];
  FT_UInt32 seed;
  char t;
  FT_Var_Axis *axis;
  char *s;
  char *subfamily_name;
  char *pcStack_98;
  FT_UInt strid;
  char *ps_name;
  long lStack_88;
  FT_UInt psid;
  FT_Long instance;
  SFNT_Service sfnt;
  char *pcStack_70;
  FT_UInt len;
  char *p;
  char *result;
  uint local_58;
  FT_UInt j;
  FT_UInt i;
  FT_Int apple;
  FT_Int win;
  FT_Int found;
  FT_MM_Var *mm_var;
  FT_Fixed *coords;
  void *pvStack_30;
  FT_UInt num_coords;
  FT_Service_MultiMasters mm;
  FT_Memory memory;
  TT_Face pTStack_18;
  FT_Error error;
  TT_Face face_local;
  
  mm = (FT_Service_MultiMasters)(face->root).memory;
  pvStack_30 = face->mm;
  p = (char *)0x0;
  pTStack_18 = face;
  if (face->var_postscript_prefix == (char *)0x0) {
    bVar3 = sfnt_get_name_id(face,0x19,(FT_Int *)&i,(FT_Int *)&j);
    apple = (FT_Int)bVar3;
    if (apple == 0) {
      bVar3 = sfnt_get_name_id(pTStack_18,0x10,(FT_Int *)&i,(FT_Int *)&j);
      apple = (FT_Int)bVar3;
    }
    if (apple == 0) {
      bVar3 = sfnt_get_name_id(pTStack_18,1,(FT_Int *)&i,(FT_Int *)&j);
      apple = (FT_Int)bVar3;
    }
    if (apple == 0) {
      return (char *)0x0;
    }
    if (i == 0xffffffff) {
      p = get_apple_string((pTStack_18->root).memory,(pTStack_18->name_table).stream,
                           (pTStack_18->name_table).names + (int)j,sfnt_is_alphanumeric,'\0');
    }
    else {
      p = get_win_string((pTStack_18->root).memory,(pTStack_18->name_table).stream,
                         (pTStack_18->name_table).names + (int)i,sfnt_is_alphanumeric,'\0');
    }
    sVar5 = strlen(p);
    sfnt._4_4_ = (uint)sVar5;
    if (0x5b < sfnt._4_4_) {
      sfnt._4_4_ = 0x5b;
      p[0x5b] = '\0';
    }
    pTStack_18->var_postscript_prefix = p;
    pTStack_18->var_postscript_prefix_len = sfnt._4_4_;
  }
  (**(code **)((long)pvStack_30 + 0x40))(pTStack_18,(long)&coords + 4,&mm_var,0,&win);
  if ((((pTStack_18->root).face_index & 0x7fff0000U) != 0) &&
     (((pTStack_18->root).face_flags & 0x8000U) == 0)) {
    instance = (FT_Long)pTStack_18->sfnt;
    lStack_88 = ((long)((pTStack_18->root).face_index & 0x7fff0000U) >> 0x10) + -1;
    ps_name._4_4_ = *(uint *)(*(long *)(_win + 0x18) + lStack_88 * 0x10 + 0xc);
    pcStack_98 = (char *)0x0;
    if ((ps_name._4_4_ == 6) || ((0xff < ps_name._4_4_ && (ps_name._4_4_ < 0x8000)))) {
      (**(code **)(instance + 0xe8))
                (pTStack_18,(short)ps_name._4_4_,&stack0xffffffffffffff68,ps_name._4_4_);
    }
    pcVar6 = pcStack_98;
    if (pcStack_98 != (char *)0x0) {
      p = pcStack_98;
      sVar5 = strlen(pcStack_98);
      pcStack_70 = pcVar6 + sVar5 + 1;
      goto LAB_0032a52d;
    }
    subfamily_name._4_4_ = *(undefined4 *)(*(long *)(_win + 0x18) + lStack_88 * 0x10 + 8);
    (**(code **)(instance + 0xe8))(pTStack_18,(short)subfamily_name._4_4_,&s,subfamily_name._4_4_);
    memory_00 = mm;
    if (s != (char *)0x0) {
      FVar1 = pTStack_18->var_postscript_prefix_len;
      sVar5 = strlen(s);
      p = (char *)ft_mem_alloc((FT_Memory)memory_00,(FVar1 + 1) + sVar5 + 1,
                               (FT_Error *)((long)&memory + 4));
      if (memory._4_4_ != 0) {
        return (char *)0x0;
      }
      strcpy(p,pTStack_18->var_postscript_prefix);
      pcStack_70 = p + pTStack_18->var_postscript_prefix_len + 1;
      p[pTStack_18->var_postscript_prefix_len] = '-';
      for (axis = (FT_Var_Axis *)s; *(char *)&axis->name != '\0';
          axis = (FT_Var_Axis *)((long)&axis->name + 1)) {
        if ((((int)*(char *)&axis->name - 0x30U < 10) || ((int)*(char *)&axis->name - 0x41U < 0x1a))
           || ((int)*(char *)&axis->name - 0x61U < 0x1a)) {
          *pcStack_70 = *(char *)&axis->name;
          pcStack_70 = pcStack_70 + 1;
        }
      }
      *pcStack_70 = '\0';
      pcStack_70 = pcStack_70 + 1;
      ft_mem_free((FT_Memory)mm,s);
      s = (char *)0x0;
      goto LAB_0032a52d;
    }
  }
  _seed = *(long *)(_win + 0x10);
  pcStack_70 = (char *)ft_mem_alloc((FT_Memory)mm,
                                    (ulong)(pTStack_18->var_postscript_prefix_len +
                                            coords._4_4_ * 0x11 + 1),(FT_Error *)((long)&memory + 4)
                                   );
  if (memory._4_4_ != 0) {
    return (char *)0x0;
  }
  p = pcStack_70;
  strcpy(pcStack_70,pTStack_18->var_postscript_prefix);
  pcStack_70 = pcStack_70 + pTStack_18->var_postscript_prefix_len;
  for (local_58 = 0; local_58 < coords._4_4_; local_58 = local_58 + 1) {
    lVar2._0_4_ = mm_var->num_axis;
    lVar2._4_4_ = mm_var->num_designs;
    if (lVar2 != *(long *)(_seed + 0x10)) {
      pcVar6 = pcStack_70 + 1;
      *pcStack_70 = '_';
      fixed = mm_var->num_axis;
      pcStack_70 = pcVar6;
      pcVar6 = fixed2float(fixed,pcVar6);
      cVar4 = (char)((ulong)*(undefined8 *)(_seed + 0x20) >> 0x18);
      pcStack_70 = pcVar6;
      if ((cVar4 != ' ') &&
         ((((int)cVar4 - 0x30U < 10 || ((int)cVar4 - 0x41U < 0x1a)) || ((int)cVar4 - 0x61U < 0x1a)))
         ) {
        pcStack_70 = pcVar6 + 1;
        *pcVar6 = cVar4;
      }
      cVar4 = (char)((ulong)*(undefined8 *)(_seed + 0x20) >> 0x10);
      if ((cVar4 != ' ') &&
         ((((int)cVar4 - 0x30U < 10 || ((int)cVar4 - 0x41U < 0x1a)) || ((int)cVar4 - 0x61U < 0x1a)))
         ) {
        *pcStack_70 = cVar4;
        pcStack_70 = pcStack_70 + 1;
      }
      cVar4 = (char)((ulong)*(undefined8 *)(_seed + 0x20) >> 8);
      if ((cVar4 != ' ') &&
         ((((int)cVar4 - 0x30U < 10 || ((int)cVar4 - 0x41U < 0x1a)) || ((int)cVar4 - 0x61U < 0x1a)))
         ) {
        *pcStack_70 = cVar4;
        pcStack_70 = pcStack_70 + 1;
      }
      cVar4 = (char)*(undefined8 *)(_seed + 0x20);
      if ((cVar4 != ' ') &&
         ((((int)cVar4 - 0x30U < 10 || ((int)cVar4 - 0x41U < 0x1a)) || ((int)cVar4 - 0x61U < 0x1a)))
         ) {
        *pcStack_70 = cVar4;
        pcStack_70 = pcStack_70 + 1;
      }
    }
    mm_var = (FT_MM_Var *)&mm_var->num_namedstyles;
    _seed = _seed + 0x30;
  }
LAB_0032a52d:
  if (0x7f < (long)pcStack_70 - (long)p) {
    murmur_hash_3_128(p,(int)pcStack_70 - (int)p,0x75bcd15,&h);
    pcVar6 = p + pTStack_18->var_postscript_prefix_len;
    *pcVar6 = '-';
    pFStack_e0 = hash + 1;
    pcVar6[0x24] = '\0';
    pcVar6[0x23] = '.';
    pcVar6[0x22] = '.';
    pcStack_70 = pcVar6 + 0x20;
    pcVar6[0x21] = '.';
    for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
      local_e4 = *pFStack_e0;
      for (result._4_4_ = 0; result._4_4_ < 8; result._4_4_ = result._4_4_ + 1) {
        *pcStack_70 = "0123456789ABCDEF"[local_e4 & 0xf];
        local_e4 = local_e4 >> 4;
        pcStack_70 = pcStack_70 + -1;
      }
      pFStack_e0 = pFStack_e0 + -1;
    }
  }
  return p;
}

Assistant:

static const char*
  sfnt_get_var_ps_name( TT_Face  face )
  {
    FT_Error   error;
    FT_Memory  memory = face->root.memory;

    FT_Service_MultiMasters  mm = (FT_Service_MultiMasters)face->mm;

    FT_UInt     num_coords;
    FT_Fixed*   coords;
    FT_MM_Var*  mm_var;

    FT_Int   found, win, apple;
    FT_UInt  i, j;

    char*  result = NULL;
    char*  p;


    if ( !face->var_postscript_prefix )
    {
      FT_UInt  len;


      /* check whether we have a Variations PostScript Name Prefix */
      found = sfnt_get_name_id( face,
                                TT_NAME_ID_VARIATIONS_PREFIX,
                                &win,
                                &apple );
      if ( !found )
      {
        /* otherwise use the typographic family name */
        found = sfnt_get_name_id( face,
                                  TT_NAME_ID_TYPOGRAPHIC_FAMILY,
                                  &win,
                                  &apple );
      }

      if ( !found )
      {
        /* as a last resort we try the family name; note that this is */
        /* not in the Adobe TechNote, but GX fonts (which predate the */
        /* TechNote) benefit from this behaviour                      */
        found = sfnt_get_name_id( face,
                                  TT_NAME_ID_FONT_FAMILY,
                                  &win,
                                  &apple );
      }

      if ( !found )
      {
        FT_TRACE0(( "sfnt_get_var_ps_name:"
                    " Can't construct PS name prefix for font instances\n" ));
        return NULL;
      }

      /* prefer Windows entries over Apple */
      if ( win != -1 )
        result = get_win_string( face->root.memory,
                                 face->name_table.stream,
                                 face->name_table.names + win,
                                 sfnt_is_alphanumeric,
                                 0 );
      else
        result = get_apple_string( face->root.memory,
                                   face->name_table.stream,
                                   face->name_table.names + apple,
                                   sfnt_is_alphanumeric,
                                   0 );

      len = ft_strlen( result );

      /* sanitize if necessary; we reserve space for 36 bytes (a 128bit  */
      /* checksum as a hex number, preceded by `-' and followed by three */
      /* ASCII dots, to be used if the constructed PS name would be too  */
      /* long); this is also sufficient for a single instance            */
      if ( len > MAX_PS_NAME_LEN - ( 1 + 32 + 3 ) )
      {
        len         = MAX_PS_NAME_LEN - ( 1 + 32 + 3 );
        result[len] = '\0';

        FT_TRACE0(( "sfnt_get_var_ps_name:"
                    " Shortening variation PS name prefix\n"
                    "                     "
                    " to %d characters\n", len ));
      }

      face->var_postscript_prefix     = result;
      face->var_postscript_prefix_len = len;
    }

    mm->get_var_blend( FT_FACE( face ),
                       &num_coords,
                       &coords,
                       NULL,
                       &mm_var );

    if ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) &&
         !FT_IS_VARIATION( FT_FACE( face ) )     )
    {
      SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

      FT_Long  instance = ( ( face->root.face_index & 0x7FFF0000L ) >> 16 ) - 1;
      FT_UInt  psid     = mm_var->namedstyle[instance].psid;

      char*  ps_name = NULL;


      /* try first to load the name string with index `postScriptNameID' */
      if ( psid == 6                      ||
           ( psid > 255 && psid < 32768 ) )
        (void)sfnt->get_name( face, (FT_UShort)psid, &ps_name );

      if ( ps_name )
      {
        result = ps_name;
        p      = result + ft_strlen( result ) + 1;

        goto check_length;
      }
      else
      {
        /* otherwise construct a name using `subfamilyNameID' */
        FT_UInt  strid = mm_var->namedstyle[instance].strid;

        char*  subfamily_name;
        char*  s;


        (void)sfnt->get_name( face, (FT_UShort)strid, &subfamily_name );

        if ( !subfamily_name )
        {
          FT_TRACE1(( "sfnt_get_var_ps_name:"
                      " can't construct named instance PS name;\n"
                      "                     "
                      " trying to construct normal instance PS name\n" ));
          goto construct_instance_name;
        }

        /* after the prefix we have character `-' followed by the   */
        /* subfamily name (using only characters a-z, A-Z, and 0-9) */
        if ( FT_ALLOC( result, face->var_postscript_prefix_len +
                               1 + ft_strlen( subfamily_name ) + 1 ) )
          return NULL;

        ft_strcpy( result, face->var_postscript_prefix );

        p = result + face->var_postscript_prefix_len;
        *p++ = '-';

        s = subfamily_name;
        while ( *s )
        {
          if ( ft_isalnum( *s ) )
            *p++ = *s;
          s++;
        }
        *p++ = '\0';

        FT_FREE( subfamily_name );
      }
    }
    else
    {
      FT_Var_Axis*  axis;


    construct_instance_name:
      axis = mm_var->axis;

      if ( FT_ALLOC( result,
                     face->var_postscript_prefix_len +
                       num_coords * MAX_VALUE_DESCRIPTOR_LEN + 1 ) )
        return NULL;

      p = result;

      ft_strcpy( p, face->var_postscript_prefix );
      p += face->var_postscript_prefix_len;

      for ( i = 0; i < num_coords; i++, coords++, axis++ )
      {
        char  t;


        /* omit axis value descriptor if it is identical */
        /* to the default axis value                     */
        if ( *coords == axis->def )
          continue;

        *p++ = '_';
        p    = fixed2float( *coords, p );

        t = (char)( axis->tag >> 24 );
        if ( t != ' ' && ft_isalnum( t ) )
          *p++ = t;
        t = (char)( axis->tag >> 16 );
        if ( t != ' ' && ft_isalnum( t ) )
          *p++ = t;
        t = (char)( axis->tag >> 8 );
        if ( t != ' ' && ft_isalnum( t ) )
          *p++ = t;
        t = (char)axis->tag;
        if ( t != ' ' && ft_isalnum( t ) )
          *p++ = t;
      }
    }

  check_length:
    if ( p - result > MAX_PS_NAME_LEN )
    {
      /* the PS name is too long; replace the part after the prefix with */
      /* a checksum; we use MurmurHash 3 with a hash length of 128 bit   */

      FT_UInt32  seed = 123456789;

      FT_UInt32   hash[4];
      FT_UInt32*  h;


      murmur_hash_3_128( result, p - result, seed, hash );

      p = result + face->var_postscript_prefix_len;
      *p++ = '-';

      /* we convert the hash value to hex digits from back to front */
      p += 32 + 3;
      h  = hash + 3;

      *p-- = '\0';
      *p-- = '.';
      *p-- = '.';
      *p-- = '.';

      for ( i = 0; i < 4; i++, h-- )
      {
        FT_UInt32  v = *h;


        for ( j = 0; j < 8; j++ )
        {
          *p--   = hexdigits[v & 0xF];
          v    >>= 4;
        }
      }
    }

    return result;
  }